

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_and_time.c
# Opt level: O0

LY_ERR lyplg_type_dup_date_and_time(ly_ctx *ctx,lyd_value *original,lyd_value *dup)

{
  char *pcVar1;
  anon_union_24_16_e2776397_for_lyd_value_2 *__s;
  lyd_value_date_and_time *dup_val;
  lyd_value_date_and_time *orig_val;
  LY_ERR ret;
  lyd_value *dup_local;
  lyd_value *original_local;
  ly_ctx *ctx_local;
  
  memset(dup,0,0x28);
  orig_val._4_4_ = lydict_insert(ctx,original->_canonical,0,&dup->_canonical);
  if (orig_val._4_4_ == LY_SUCCESS) {
    __s = &dup->field_2;
    memset(__s,0,0x18);
    if (__s != (anon_union_24_16_e2776397_for_lyd_value_2 *)0x0) {
      __s->dec64 = (original->field_2).dec64;
      (dup->field_2).fixed_mem[0x10] = (original->field_2).fixed_mem[0x10];
      if (*(long *)((long)&original->field_2 + 8) != 0) {
        pcVar1 = strdup(*(char **)((long)&original->field_2 + 8));
        *(char **)((long)&dup->field_2 + 8) = pcVar1;
        if (*(long *)((long)&dup->field_2 + 8) == 0) {
          orig_val._4_4_ = LY_EMEM;
          goto LAB_0023bd74;
        }
      }
      dup->realtype = original->realtype;
      return LY_SUCCESS;
    }
    orig_val._4_4_ = LY_EMEM;
  }
LAB_0023bd74:
  lyplg_type_free_date_and_time(ctx,dup);
  return orig_val._4_4_;
}

Assistant:

static LY_ERR
lyplg_type_dup_date_and_time(const struct ly_ctx *ctx, const struct lyd_value *original, struct lyd_value *dup)
{
    LY_ERR ret;
    struct lyd_value_date_and_time *orig_val, *dup_val;

    memset(dup, 0, sizeof *dup);

    /* optional canonical value */
    ret = lydict_insert(ctx, original->_canonical, 0, &dup->_canonical);
    LY_CHECK_GOTO(ret, error);

    /* allocate value */
    LYPLG_TYPE_VAL_INLINE_PREPARE(dup, dup_val);
    LY_CHECK_ERR_GOTO(!dup_val, ret = LY_EMEM, error);

    LYD_VALUE_GET(original, orig_val);

    /* copy timestamp and unknown tz */
    dup_val->time = orig_val->time;
    dup_val->unknown_tz = orig_val->unknown_tz;

    /* duplicate second fractions */
    if (orig_val->fractions_s) {
        dup_val->fractions_s = strdup(orig_val->fractions_s);
        LY_CHECK_ERR_GOTO(!dup_val->fractions_s, ret = LY_EMEM, error);
    }

    dup->realtype = original->realtype;
    return LY_SUCCESS;

error:
    lyplg_type_free_date_and_time(ctx, dup);
    return ret;
}